

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O0

int find_process_slot(int pid)

{
  int local_14;
  int slot;
  int pid_local;
  
  local_14 = 0;
  while( true ) {
    if (NPROCS <= local_14) {
      return -1;
    }
    if (UJ[local_14].PID == pid) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int find_process_slot(int pid)
/* Find a slot with the specified pid */

{
  for (int slot = 0; slot < NPROCS; slot++)
    if (UJ[slot].PID == pid) {
      DBPRINT(("find_process_slot = %d.\n", slot));
      return slot;
    }
  return -1;
}